

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_k_tflw.c
# Opt level: O3

void N_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  
  pdVar1 = (double *)p->params;
  dVar2 = get_ext_param(p,ext_params,0);
  dVar2 = cbrt(dVar2 * 4.0);
  dVar2 = 1.0 / dVar2;
  dVar3 = dVar2 * dVar2;
  *pdVar1 = (dVar3 * dVar3) / -3.0 + dVar3 + dVar3 + dVar2 * -2.6666666666666665 + 1.0;
  return;
}

Assistant:

static void
N_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double C0 = CBRT(M_PI/3.0);
  double C1 = CBRT(M_PI*M_PI/36.0)/6.0 - CBRT(M_PI*M_PI/9.0)/4.0;
  double N;
  gga_k_tflw_params *params;

  assert(p != NULL && p->params != NULL);
  params = (gga_k_tflw_params *) (p->params);

  N = get_ext_param(p, ext_params, 0);

  params->gamma = 1.0;
  params->lambda = 1.0;

  switch(p->info->number){
  case XC_GGA_K_ABSP1:
    params->gamma = 1.0 - 1.412/CBRT(N);
    break;
  case XC_GGA_K_ABSP2:
    params->gamma = 1.0 - 1.332/CBRT(N);
    break;
  case XC_GGA_K_ABSP3:
    params->gamma = 1.0 - 1.513/pow(N, 0.35);
    break;
  case XC_GGA_K_ABSP4:
    params->gamma = 1.0/(1.0 + 1.332/CBRT(N));
    params->lambda = params->gamma;
    break;
  case XC_GGA_K_GR:
    params->gamma = (1.0 - 2.0/N)*(1.0 - C0/CBRT(N) + C1*CBRT(N*N));
    break;
  case XC_GGA_K_LUDENA:
    params->gamma = CBRT(6.0*M_PI)*M_PI*M_PI*(1.0 - 1.0/(N*N));
    break;
  case XC_GGA_K_GP85:
    params->gamma = CBRT(6.0*M_PI*M_PI)*M_PI*M_PI/4.0*
      (1.0 - 1.0/N)*(1.0 + 1.0/N + 6.0/(N*N));
    break;
  }
}